

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O2

MaybeResult<wasm::Ok> *
wasm::WATParser::import_<wasm::WATParser::ParseDeclsCtx>
          (MaybeResult<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx)

{
  bool *pbVar1;
  size_t sVar2;
  TableType type_00;
  MemType type_01;
  bool bVar3;
  bool *pbVar4;
  undefined8 uVar5;
  undefined1 auVar6 [8];
  string *this;
  Index pos;
  string_view expected;
  string_view expected_00;
  string_view expected_01;
  string_view expected_02;
  string_view expected_03;
  string_view expected_04;
  Name name_00;
  Name name_01;
  undefined1 auStack_1d8 [8];
  optional<wasm::Name> mod;
  optional<wasm::Name> nm;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  _Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_> local_108;
  undefined1 auStack_e8 [8];
  ImportNames names;
  undefined1 local_c0 [8];
  optional<wasm::Name> name;
  Result<wasm::Ok> type;
  Result<wasm::Ok> _val;
  _Vector_base<wasm::Name,_std::allocator<wasm::Name>_> local_48;
  
  sVar2 = (ctx->in).pos;
  expected._M_str = "import";
  expected._M_len = 6;
  bVar3 = Lexer::takeSExprStart(&ctx->in,expected);
  if (!bVar3) {
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x01';
    return __return_storage_ptr__;
  }
  Lexer::takeName((optional<wasm::Name> *)auStack_1d8,&ctx->in);
  if (mod.super__Optional_base<wasm::Name,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Name>._M_payload._8_1_ == '\0') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &nm.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Name>._M_engaged,"expected import module name",
               (allocator<char> *)&stack0xffffffffffffff88);
    Lexer::err((Err *)&name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                       super__Optional_payload_base<wasm::Name>._M_engaged,&ctx->in,
               (string *)
               &nm.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Name>._M_engaged);
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
    _Variant_storage<2ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
               &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Name>._M_engaged);
    std::__cxx11::string::~string
              ((string *)
               &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Name>._M_engaged);
    this = (string *)
           &nm.super__Optional_base<wasm::Name,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Name>._M_engaged;
    goto LAB_00c03eee;
  }
  Lexer::takeName((optional<wasm::Name> *)
                  &mod.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                   super__Optional_payload_base<wasm::Name>._M_engaged,&ctx->in);
  if (nm.super__Optional_base<wasm::Name,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Name>._M_payload._8_1_ == '\0') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_188,"expected import name",
               (allocator<char> *)&stack0xffffffffffffff88);
    Lexer::err((Err *)&name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                       super__Optional_payload_base<wasm::Name>._M_engaged,&ctx->in,&local_188);
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
    _Variant_storage<2ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
               &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Name>._M_engaged);
    std::__cxx11::string::~string
              ((string *)
               &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Name>._M_engaged);
    this = &local_188;
    goto LAB_00c03eee;
  }
  auStack_e8 = auStack_1d8;
  names.mod.super_IString.str._M_len =
       mod.super__Optional_base<wasm::Name,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_len;
  names.mod.super_IString.str._M_str =
       (char *)mod.super__Optional_base<wasm::Name,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::Name>._16_8_;
  names.nm.super_IString.str._M_len =
       nm.super__Optional_base<wasm::Name,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_len;
  expected_00._M_str = "func";
  expected_00._M_len = 4;
  bVar3 = Lexer::takeSExprStart(&ctx->in,expected_00);
  pos = (Index)sVar2;
  if (bVar3) {
    Lexer::takeID((optional<wasm::Name> *)local_c0,&ctx->in);
    pbVar1 = &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::Name>._M_engaged;
    typeuse<wasm::WATParser::ParseDeclsCtx>((Result<wasm::Ok> *)pbVar1,ctx,true);
    std::__detail::__variant::_Copy_ctor_base<false,_wasm::Ok,_wasm::Err>::_Copy_ctor_base
              ((_Copy_ctor_base<false,_wasm::Ok,_wasm::Err> *)&stack0xffffffffffffff88,
               (_Copy_ctor_base<false,_wasm::Ok,_wasm::Err> *)pbVar1);
    if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
      std::__cxx11::string::string((string *)&local_48,(string *)&stack0xffffffffffffff88);
      std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
      _Variant_storage<2ul,wasm::Err>
                ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
                 &local_48);
LAB_00c041d3:
      std::__cxx11::string::~string((string *)&local_48);
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)&stack0xffffffffffffff88);
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                 &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::Name>._M_engaged);
      return __return_storage_ptr__;
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)&stack0xffffffffffffff88);
    if (name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Name>._M_payload._8_1_ == '\0') {
      name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_len = 0;
      local_c0 = (undefined1  [8])0x0;
    }
    local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_108._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_108._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_108._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ParseDeclsCtx::addFunc
              (&stack0xffffffffffffff88,ctx,local_c0,
               name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_len
               ,&local_48,auStack_e8,0,(int)&local_108,pos);
    std::_Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>::
    ~_Vector_base(&local_108);
    std::_Vector_base<wasm::Name,_std::allocator<wasm::Name>_>::~_Vector_base(&local_48);
    if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
      std::__cxx11::string::string((string *)&local_48,(string *)&stack0xffffffffffffff88);
      std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
      _Variant_storage<2ul,wasm::Err>
                ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
                 &local_48);
      goto LAB_00c041d3;
    }
LAB_00c044ad:
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)&stack0xffffffffffffff88);
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
               &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Name>._M_engaged);
  }
  else {
    expected_01._M_str = "table";
    expected_01._M_len = 5;
    bVar3 = Lexer::takeSExprStart(&ctx->in,expected_01);
    if (bVar3) {
      Lexer::takeID((optional<wasm::Name> *)local_c0,&ctx->in);
      pbVar1 = &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Name>._M_engaged;
      tabletype<wasm::WATParser::ParseDeclsCtx>((Result<wasm::WATParser::TableType> *)pbVar1,ctx);
      std::__detail::__variant::_Copy_ctor_base<false,_wasm::WATParser::TableType,_wasm::Err>::
      _Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::TableType,_wasm::Err> *)
                      &stack0xffffffffffffff88,
                      (_Copy_ctor_base<false,_wasm::WATParser::TableType,_wasm::Err> *)pbVar1);
      if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
        std::__cxx11::string::string((string *)&local_48,(string *)&stack0xffffffffffffff88);
        std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
        _Variant_storage<2ul,wasm::Err>
                  ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
                   &local_48);
        std::__cxx11::string::~string((string *)&local_48);
        std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::TableType,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TableType,_wasm::Err> *)
                          &stack0xffffffffffffff88);
LAB_00c04146:
        std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::TableType,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TableType,_wasm::Err> *)
                          &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                           super__Optional_payload_base<wasm::Name>._M_engaged);
        return __return_storage_ptr__;
      }
      std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::TableType,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TableType,_wasm::Err> *)
                        &stack0xffffffffffffff88);
      uVar5 = (char *)0x0;
      auVar6 = (undefined1  [8])0;
      if (name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Name>._M_payload._8_1_ != '\0') {
        uVar5 = name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str.
                _M_len;
        auVar6 = local_c0;
      }
      local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pbVar4 = (bool *)0x0;
      if (type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\0') {
        pbVar4 = pbVar1;
      }
      type_00.limits.initial._4_4_ = (int)((ulong)*(undefined8 *)(pbVar4 + 8) >> 0x20);
      type_00._0_12_ = *(undefined1 (*) [12])pbVar4;
      type_00.limits.max.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_4_ =
           (int)*(undefined8 *)(pbVar4 + 0x10);
      type_00.limits.max.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_payload._M_value._4_4_ =
           (int)((ulong)*(undefined8 *)(pbVar4 + 0x10) >> 0x20);
      type_00.limits.max.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._8_8_ =
           *(undefined8 *)*(undefined1 (*) [12])(pbVar4 + 0x18);
      name_00.super_IString.str._M_str = (char *)uVar5;
      name_00.super_IString.str._M_len = (size_t)auVar6;
      ParseDeclsCtx::addTable
                ((Result<wasm::Ok> *)&stack0xffffffffffffff88,ctx,name_00,
                 (vector<wasm::Name,_std::allocator<wasm::Name>_> *)&local_48,
                 (ImportNames *)auStack_e8,type_00,pos);
      std::_Vector_base<wasm::Name,_std::allocator<wasm::Name>_>::~_Vector_base(&local_48);
      if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
        std::__cxx11::string::string((string *)&local_48,(string *)&stack0xffffffffffffff88);
        std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
        _Variant_storage<2ul,wasm::Err>
                  ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
                   &local_48);
        std::__cxx11::string::~string((string *)&local_48);
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)&stack0xffffffffffffff88);
        goto LAB_00c04146;
      }
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)&stack0xffffffffffffff88);
      std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::TableType,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TableType,_wasm::Err> *)
                        &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                         super__Optional_payload_base<wasm::Name>._M_engaged);
    }
    else {
      expected_02._M_str = "memory";
      expected_02._M_len = 6;
      bVar3 = Lexer::takeSExprStart(&ctx->in,expected_02);
      if (!bVar3) {
        expected_03._M_str = "global";
        expected_03._M_len = 6;
        bVar3 = Lexer::takeSExprStart(&ctx->in,expected_03);
        if (bVar3) {
          Lexer::takeID((optional<wasm::Name> *)local_c0,&ctx->in);
          pbVar1 = &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::Name>._M_engaged;
          globaltype<wasm::WATParser::ParseDeclsCtx>((Result<wasm::Ok> *)pbVar1,ctx);
          std::__detail::__variant::_Copy_ctor_base<false,_wasm::Ok,_wasm::Err>::_Copy_ctor_base
                    ((_Copy_ctor_base<false,_wasm::Ok,_wasm::Err> *)&stack0xffffffffffffff88,
                     (_Copy_ctor_base<false,_wasm::Ok,_wasm::Err> *)pbVar1);
          if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
            std::__cxx11::string::string((string *)&local_48,(string *)&stack0xffffffffffffff88);
            std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
            _Variant_storage<2ul,wasm::Err>
                      ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)
                       __return_storage_ptr__,&local_48);
            goto LAB_00c041d3;
          }
          std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                    ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)&stack0xffffffffffffff88);
          if (name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::Name>._M_payload._8_1_ == '\0') {
            local_c0 = (undefined1  [8])0x0;
            name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_len =
                 0;
          }
          local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ParseDeclsCtx::addGlobal
                    (&stack0xffffffffffffff88,ctx,local_c0,
                     name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                     super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str.
                     _M_len,&local_48,auStack_e8,0,pos);
          std::_Vector_base<wasm::Name,_std::allocator<wasm::Name>_>::~_Vector_base(&local_48);
          if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
            std::__cxx11::string::string((string *)&local_48,(string *)&stack0xffffffffffffff88);
            std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
            _Variant_storage<2ul,wasm::Err>
                      ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)
                       __return_storage_ptr__,&local_48);
            goto LAB_00c041d3;
          }
        }
        else {
          expected_04._M_str = "tag";
          expected_04._M_len = 3;
          bVar3 = Lexer::takeSExprStart(&ctx->in,expected_04);
          if (!bVar3) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_168,"expected import description",
                       (allocator<char> *)&stack0xffffffffffffff88);
            Lexer::err((Err *)&name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                               super__Optional_payload_base<wasm::Name>._M_engaged,&ctx->in,
                       &local_168);
            std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
            _Variant_storage<2ul,wasm::Err>
                      ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)
                       __return_storage_ptr__,
                       &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                        super__Optional_payload_base<wasm::Name>._M_engaged);
            std::__cxx11::string::~string
                      ((string *)
                       &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                        super__Optional_payload_base<wasm::Name>._M_engaged);
            this = &local_168;
            goto LAB_00c03eee;
          }
          Lexer::takeID((optional<wasm::Name> *)local_c0,&ctx->in);
          pbVar1 = &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::Name>._M_engaged;
          typeuse<wasm::WATParser::ParseDeclsCtx>((Result<wasm::Ok> *)pbVar1,ctx,true);
          std::__detail::__variant::_Copy_ctor_base<false,_wasm::Ok,_wasm::Err>::_Copy_ctor_base
                    ((_Copy_ctor_base<false,_wasm::Ok,_wasm::Err> *)&stack0xffffffffffffff88,
                     (_Copy_ctor_base<false,_wasm::Ok,_wasm::Err> *)pbVar1);
          if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
            std::__cxx11::string::string((string *)&local_48,(string *)&stack0xffffffffffffff88);
            std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
            _Variant_storage<2ul,wasm::Err>
                      ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)
                       __return_storage_ptr__,&local_48);
            goto LAB_00c041d3;
          }
          std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                    ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)&stack0xffffffffffffff88);
          if (name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::Name>._M_payload._8_1_ == '\0') {
            local_c0 = (undefined1  [8])0x0;
            name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_len =
                 0;
          }
          local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ParseDeclsCtx::addTag
                    (&stack0xffffffffffffff88,ctx,local_c0,
                     name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                     super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str.
                     _M_len,&local_48,auStack_e8,pos);
          std::_Vector_base<wasm::Name,_std::allocator<wasm::Name>_>::~_Vector_base(&local_48);
          if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
            std::__cxx11::string::string((string *)&local_48,(string *)&stack0xffffffffffffff88);
            std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
            _Variant_storage<2ul,wasm::Err>
                      ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)
                       __return_storage_ptr__,&local_48);
            goto LAB_00c041d3;
          }
        }
        goto LAB_00c044ad;
      }
      Lexer::takeID((optional<wasm::Name> *)local_c0,&ctx->in);
      pbVar1 = &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Name>._M_engaged;
      memtype<wasm::WATParser::ParseDeclsCtx>((Result<wasm::WATParser::MemType> *)pbVar1,ctx);
      std::__detail::__variant::_Copy_ctor_base<false,_wasm::WATParser::MemType,_wasm::Err>::
      _Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::MemType,_wasm::Err> *)
                      &stack0xffffffffffffff88,
                      (_Copy_ctor_base<false,_wasm::WATParser::MemType,_wasm::Err> *)pbVar1);
      if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_index == '\x01') {
        std::__cxx11::string::string((string *)&local_48,(string *)&stack0xffffffffffffff88);
        std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
        _Variant_storage<2ul,wasm::Err>
                  ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
                   &local_48);
        std::__cxx11::string::~string((string *)&local_48);
        std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::MemType,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::MemType,_wasm::Err> *)
                          &stack0xffffffffffffff88);
LAB_00c0431b:
        std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::MemType,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::MemType,_wasm::Err> *)
                          &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                           super__Optional_payload_base<wasm::Name>._M_engaged);
        return __return_storage_ptr__;
      }
      std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::MemType,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::MemType,_wasm::Err> *)
                        &stack0xffffffffffffff88);
      uVar5 = (char *)0x0;
      auVar6 = (undefined1  [8])0;
      if (name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Name>._M_payload._8_1_ != '\0') {
        uVar5 = name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str.
                _M_len;
        auVar6 = local_c0;
      }
      local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pbVar4 = (bool *)0x0;
      if (type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_index == '\0') {
        pbVar4 = pbVar1;
      }
      type_01.limits.initial._4_4_ = (int)((ulong)*(undefined8 *)(pbVar4 + 8) >> 0x20);
      type_01._0_12_ = *(undefined1 (*) [12])pbVar4;
      type_01.limits.max.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_4_ =
           (int)*(undefined8 *)(pbVar4 + 0x10);
      type_01.limits.max.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_payload._M_value._4_4_ =
           (int)((ulong)*(undefined8 *)(pbVar4 + 0x10) >> 0x20);
      type_01.limits.max.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._8_8_ =
           *(undefined8 *)*(undefined1 (*) [12])(pbVar4 + 0x18);
      type_01._32_4_ = (int)*(undefined8 *)(pbVar4 + 0x20);
      type_01._36_4_ = (int)((ulong)*(undefined8 *)(pbVar4 + 0x20) >> 0x20);
      name_01.super_IString.str._M_str = (char *)uVar5;
      name_01.super_IString.str._M_len = (size_t)auVar6;
      ParseDeclsCtx::addMemory
                ((Result<wasm::Ok> *)&stack0xffffffffffffff88,ctx,name_01,
                 (vector<wasm::Name,_std::allocator<wasm::Name>_> *)&local_48,
                 (ImportNames *)auStack_e8,type_01,pos);
      std::_Vector_base<wasm::Name,_std::allocator<wasm::Name>_>::~_Vector_base(&local_48);
      if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
        std::__cxx11::string::string((string *)&local_48,(string *)&stack0xffffffffffffff88);
        std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
        _Variant_storage<2ul,wasm::Err>
                  ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
                   &local_48);
        std::__cxx11::string::~string((string *)&local_48);
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)&stack0xffffffffffffff88);
        goto LAB_00c0431b;
      }
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)&stack0xffffffffffffff88);
      std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::MemType,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::MemType,_wasm::Err> *)
                        &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                         super__Optional_payload_base<wasm::Name>._M_engaged);
    }
  }
  bVar3 = Lexer::takeRParen(&ctx->in);
  if (bVar3) {
    bVar3 = Lexer::takeRParen(&ctx->in);
    if (bVar3) {
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\0';
      return __return_storage_ptr__;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_128,"expected end of import",
               (allocator<char> *)&stack0xffffffffffffff88);
    Lexer::err((Err *)&name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                       super__Optional_payload_base<wasm::Name>._M_engaged,&ctx->in,&local_128);
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
    _Variant_storage<2ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
               &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Name>._M_engaged);
    std::__cxx11::string::~string
              ((string *)
               &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Name>._M_engaged);
    this = &local_128;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_148,"expected end of import description",
               (allocator<char> *)&stack0xffffffffffffff88);
    Lexer::err((Err *)&name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                       super__Optional_payload_base<wasm::Name>._M_engaged,&ctx->in,&local_148);
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
    _Variant_storage<2ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
               &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Name>._M_engaged);
    std::__cxx11::string::~string
              ((string *)
               &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Name>._M_engaged);
    this = &local_148;
  }
LAB_00c03eee:
  std::__cxx11::string::~string((string *)this);
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<> import_(Ctx& ctx) {
  auto pos = ctx.in.getPos();

  if (!ctx.in.takeSExprStart("import"sv)) {
    return {};
  }

  auto mod = ctx.in.takeName();
  if (!mod) {
    return ctx.in.err("expected import module name");
  }

  auto nm = ctx.in.takeName();
  if (!nm) {
    return ctx.in.err("expected import name");
  }
  ImportNames names{*mod, *nm};

  if (ctx.in.takeSExprStart("func"sv)) {
    auto name = ctx.in.takeID();
    auto type = typeuse(ctx);
    CHECK_ERR(type);
    // TODO: function import annotations
    CHECK_ERR(ctx.addFunc(
      name ? *name : Name{}, {}, &names, *type, std::nullopt, {}, pos));
  } else if (ctx.in.takeSExprStart("table"sv)) {
    auto name = ctx.in.takeID();
    auto type = tabletype(ctx);
    CHECK_ERR(type);
    CHECK_ERR(ctx.addTable(name ? *name : Name{}, {}, &names, *type, pos));
  } else if (ctx.in.takeSExprStart("memory"sv)) {
    auto name = ctx.in.takeID();
    auto type = memtype(ctx);
    CHECK_ERR(type);
    CHECK_ERR(ctx.addMemory(name ? *name : Name{}, {}, &names, *type, pos));
  } else if (ctx.in.takeSExprStart("global"sv)) {
    auto name = ctx.in.takeID();
    auto type = globaltype(ctx);
    CHECK_ERR(type);
    CHECK_ERR(ctx.addGlobal(
      name ? *name : Name{}, {}, &names, *type, std::nullopt, pos));
  } else if (ctx.in.takeSExprStart("tag"sv)) {
    auto name = ctx.in.takeID();
    auto type = typeuse(ctx);
    CHECK_ERR(type);
    CHECK_ERR(ctx.addTag(name ? *name : Name{}, {}, &names, *type, pos));
  } else {
    return ctx.in.err("expected import description");
  }

  if (!ctx.in.takeRParen()) {
    return ctx.in.err("expected end of import description");
  }
  if (!ctx.in.takeRParen()) {
    return ctx.in.err("expected end of import");
  }

  return Ok{};
}